

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PQ.h
# Opt level: O0

void __thiscall
ProductQuantization<float,_KBalls<float>_>::productJoinClusters
          (ProductQuantization<float,_KBalls<float>_> *this)

{
  AbstractKMeans<float> *this_00;
  vector<Cluster<float>,_std::allocator<Cluster<float>_>_> *pvVar1;
  size_type sVar2;
  const_reference __args_1;
  Cluster<float> *initialCluster;
  int local_4c;
  int i;
  KBalls<float> *subKMeans;
  function<void_(int,_const_Cluster<float>_&)> *local_38;
  undefined1 local_30 [8];
  function<void_(int,_const_Cluster<float>_&)> mergeRecursive;
  ProductQuantization<float,_KBalls<float>_> *this_local;
  
  mergeRecursive._M_invoker = (_Invoker_type)this;
  std::function<void_(int,_const_Cluster<float>_&)>::function
            ((function<void_(int,_const_Cluster<float>_&)> *)local_30);
  local_38 = (function<void_(int,_const_Cluster<float>_&)> *)local_30;
  subKMeans = (KBalls<float> *)this;
  std::function<void(int,Cluster<float>const&)>::operator=
            ((function<void(int,Cluster<float>const&)> *)local_30,
             (anon_class_16_2_9c50e7d5 *)&subKMeans);
  this_00 = (AbstractKMeans<float> *)
            std::vector<KBalls<float>,_std::allocator<KBalls<float>_>_>::operator[]
                      (&this->kMeans_,0);
  local_4c = 0;
  while( true ) {
    pvVar1 = AbstractKMeans<float>::getClusters(this_00);
    sVar2 = std::vector<Cluster<float>,_std::allocator<Cluster<float>_>_>::size(pvVar1);
    if (sVar2 <= (ulong)(long)local_4c) break;
    pvVar1 = AbstractKMeans<float>::getClusters(this_00);
    __args_1 = std::vector<Cluster<float>,_std::allocator<Cluster<float>_>_>::operator[]
                         (pvVar1,(long)local_4c);
    std::function<void_(int,_const_Cluster<float>_&)>::operator()
              ((function<void_(int,_const_Cluster<float>_&)> *)local_30,1,__args_1);
    local_4c = local_4c + 1;
  }
  std::function<void_(int,_const_Cluster<float>_&)>::~function
            ((function<void_(int,_const_Cluster<float>_&)> *)local_30);
  return;
}

Assistant:

void ProductQuantization<DataType, KMeansType>::productJoinClusters() {

    /**
     *  join function for two code book.
     */
    std::function<void (int, const Cluster<DataType>& )> mergeRecursive;

    mergeRecursive = [&] (int codebook_index, const Cluster<DataType>& cluster) {

        if (codebook_index == num_codebook_) {

            tables_.emplace(std::make_pair(cluster.getID(), cluster));
        } else {

            KMeansType& subKMeans = kMeans_[codebook_index];
            for (int i = 0; i < clusterK_; ++i) {
                // joined with the codebook_index'th code book
                Cluster<DataType> mergedCluster = cluster.merge( subKMeans.getClusters()[i], clusterK_ );
                // then joined with the (codebook_index+1)'th code book
                mergeRecursive(codebook_index+1, mergedCluster );
            }
        }
    };

    // start with kMeans[0]
    KMeansType& subKMeans = kMeans_[0];

    for (int i = 0; i < subKMeans.getClusters().size(); ++i) {

        // initialize cluster with al clusters in kMeans[0],
        const Cluster<DataType>& initialCluster =  subKMeans.getClusters()[i];
        // then merge clusters in kMeans[1], then merge cluster in kMeans[2] ....
        mergeRecursive(1, initialCluster );
    }

}